

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QList<int> * __thiscall
QMainWindowLayoutState::gapIndex
          (QList<int> *__return_storage_ptr__,QMainWindowLayoutState *this,QWidget *widget,
          QPoint *pos)

{
  QToolBar *pQVar1;
  QDockWidget *pQVar2;
  QDockWidgetGroupWindow *pQVar3;
  QDockAreaLayoutInfo *pQVar4;
  parameter_type t;
  long in_FS_OFFSET;
  bool disallowTabs;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&widget->super_QObject);
  if (pQVar1 == (QToolBar *)0x0) {
    pQVar2 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject);
    if ((pQVar2 == (QDockWidget *)0x0) &&
       (pQVar3 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                           (&widget->super_QObject), pQVar3 == (QDockWidgetGroupWindow *)0x0))
    goto LAB_00400425;
    pQVar3 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>(&widget->super_QObject)
    ;
    if (pQVar3 == (QDockWidgetGroupWindow *)0x0) {
      disallowTabs = false;
    }
    else {
      pQVar4 = QDockWidgetGroupWindow::tabLayoutInfo((QDockWidgetGroupWindow *)pQVar3);
      disallowTabs = pQVar4 == (QDockAreaLayoutInfo *)0x0;
    }
    QDockAreaLayout::gapIndex((QList<int> *)&local_40,&this->dockAreaLayout,pos,disallowTabs);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
    if ((__return_storage_ptr__->d).size == 0) goto LAB_00400425;
    t = 1;
  }
  else {
    QToolBarAreaLayout::gapIndex((QList<int> *)&local_40,&this->toolBarAreaLayout,pos);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
    t = 0;
    if ((__return_storage_ptr__->d).size == 0) goto LAB_00400425;
  }
  QList<int>::prepend(__return_storage_ptr__,t);
LAB_00400425:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QMainWindowLayoutState::gapIndex(QWidget *widget,
                                            const QPoint &pos) const
{
    QList<int> result;

#if QT_CONFIG(toolbar)
    // is it a toolbar?
    if (qobject_cast<QToolBar*>(widget) != nullptr) {
        result = toolBarAreaLayout.gapIndex(pos);
        if (!result.isEmpty())
            result.prepend(0);
        return result;
    }
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (qobject_cast<QDockWidget *>(widget) != nullptr
            || qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        bool disallowTabs = false;
#if QT_CONFIG(tabbar)
        if (auto *group = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            if (!group->tabLayoutInfo()) // Disallow to drop nested docks as a tab
                disallowTabs = true;
        }
#endif
        result = dockAreaLayout.gapIndex(pos, disallowTabs);
        if (!result.isEmpty())
            result.prepend(1);
        return result;
    }
#endif // QT_CONFIG(dockwidget)

    return result;
}